

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererTests.cpp
# Opt level: O2

void __thiscall
agge::tests::RendererTests::RendererAdapterShiftsPixelsCoordinatesAccordinglyToTheOffset
          (RendererTests *this)

{
  uint8_t covers [5];
  allocator local_229;
  bitmap<int,_0UL,_0UL> bitmap;
  blender<int,_unsigned_char> blender;
  string local_1f0;
  LocationInfo local_1d0;
  LocationInfo local_1a8;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 uStack_138;
  undefined4 uStack_130;
  undefined4 local_12c;
  undefined4 uStack_128;
  undefined8 uStack_124;
  renderer_adapter r2;
  renderer_adapter r1;
  int reference1 [35];
  
  covers[4] = 'y';
  covers[0] = '\x10';
  covers[1] = '\x19';
  covers[2] = 0xf7;
  covers[3] = 0xe3;
  blender.filling_log.
  super__Vector_base<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  blender.filling_log.
  super__Vector_base<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  blender.filling_log.
  super__Vector_base<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  mocks::bitmap<int,_0UL,_0UL>::bitmap(&bitmap,7,5);
  r1._offset.dx = -3;
  r1._offset.dy = -2;
  r1._window.x2 = bitmap._width - 3;
  r1._window.y2 = bitmap._height - 2;
  r1._window.x1 = -3;
  r1._window.y1 = -2;
  r1._blender = &blender;
  r1._bitmap = &bitmap;
  renderer::
  adapter<agge::tests::mocks::bitmap<int,_0UL,_0UL>,_agge::tests::mocks::blender<int,_unsigned_char>_>
  ::set_y(&r1,-1);
  renderer::
  adapter<agge::tests::mocks::bitmap<int,_0UL,_0UL>,_agge::tests::mocks::blender<int,_unsigned_char>_>
  ::operator()(&r1,-2,3,covers);
  renderer::
  adapter<agge::tests::mocks::bitmap<int,_0UL,_0UL>,_agge::tests::mocks::blender<int,_unsigned_char>_>
  ::set_y(&r1,1);
  renderer::
  adapter<agge::tests::mocks::bitmap<int,_0UL,_0UL>,_agge::tests::mocks::blender<int,_unsigned_char>_>
  ::operator()(&r1,0,2,covers);
  renderer::
  adapter<agge::tests::mocks::bitmap<int,_0UL,_0UL>,_agge::tests::mocks::blender<int,_unsigned_char>_>
  ::set_y(&r1,2);
  renderer::
  adapter<agge::tests::mocks::bitmap<int,_0UL,_0UL>,_agge::tests::mocks::blender<int,_unsigned_char>_>
  ::operator()(&r1,1,3,covers);
  memcpy(reference1,&DAT_001a8a90,0x8c);
  std::__cxx11::string::string
            ((string *)&r2,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
             ,(allocator *)&local_1d0);
  ut::LocationInfo::LocationInfo(&local_1a8,(string *)&r2,0x2ec);
  ut::are_equal<int,35ul,std::vector<int,std::allocator<int>>>(&reference1,&bitmap.data,&local_1a8);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_1a8.filename._M_dataplus._M_p =
       (pointer)((ulong)local_1a8.filename._M_dataplus._M_p._4_4_ << 0x20);
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&bitmap.data,
             (long)bitmap.data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)bitmap.data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2,(value_type_conflict1 *)&local_1a8);
  r2._offset.dx = 0x50;
  r2._offset.dy = 0x30;
  r2._window.x2 = bitmap._width + 0x50;
  r2._window.y2 = bitmap._height + 0x30;
  r2._window.x1 = 0x50;
  r2._window.y1 = 0x30;
  r2._blender = &blender;
  r2._bitmap = &bitmap;
  renderer::
  adapter<agge::tests::mocks::bitmap<int,_0UL,_0UL>,_agge::tests::mocks::blender<int,_unsigned_char>_>
  ::set_y(&r2,0x30);
  renderer::
  adapter<agge::tests::mocks::bitmap<int,_0UL,_0UL>,_agge::tests::mocks::blender<int,_unsigned_char>_>
  ::operator()(&r2,0x50,4,covers);
  uStack_128 = 0;
  uStack_124 = 0;
  uStack_138 = 0;
  uStack_130 = 0;
  local_12c = 0;
  local_148 = 0;
  uStack_140 = 0;
  local_158 = 0;
  uStack_150 = 0;
  local_168 = 0;
  uStack_160 = 0;
  local_178 = 0;
  uStack_170 = 0;
  local_1a8.line = 0;
  local_1a8._36_4_ = 0;
  uStack_180 = 0;
  local_1a8.filename.field_2._M_allocated_capacity = 0;
  local_1a8.filename.field_2._8_8_ = 0;
  local_1a8.filename._M_dataplus._M_p = (pointer)0x30501900305010;
  local_1a8.filename._M_string_length = 0x3050e3003050f7;
  std::__cxx11::string::string
            ((string *)&local_1f0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
             ,&local_229);
  ut::LocationInfo::LocationInfo(&local_1d0,&local_1f0,0x301);
  ut::are_equal<int,35ul,std::vector<int,std::allocator<int>>>
            ((int (*) [35])&local_1a8,&bitmap.data,&local_1d0);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&bitmap);
  std::
  _Vector_base<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry>_>
  ::~_Vector_base((_Vector_base<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry>_>
                   *)&blender);
  return;
}

Assistant:

test( RendererAdapterShiftsPixelsCoordinatesAccordinglyToTheOffset )
			{
				// INIT
				uint8_t covers[] = { 0x10, 0x19, 0xF7, 0xE3, 0x79, };
				mocks::blender<int, uint8_t> blender;
				mocks::bitmap<int> bitmap(7, 5);

				typedef renderer::adapter< mocks::bitmap<int>, mocks::blender<int, uint8_t> > renderer_adapter;

				// INIT / ACT
				renderer_adapter r1(bitmap, mkvector(-3, -2), 0, blender);

				// ACT
				r1.set_y(-1);
				r1(-2, 3, covers);
				
				r1.set_y(1);
				r1(0, 2, covers);
				
				r1.set_y(2);
				r1(1, 3, covers);

				// ASSERT
				int reference1[] = {
					0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000,
					0x00000000, 0x00FFFE10, 0x00FFFE19, 0x00FFFEF7, 0x00000000, 0x00000000, 0x00000000,
					0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000,
					0x00000000, 0x00000000, 0x00000000, 0x00010010, 0x00010019, 0x00000000, 0x00000000,
					0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00020110, 0x00020119, 0x000201F7,
				};

				assert_equal(reference1, bitmap.data);

				// INIT
				bitmap.data.assign(bitmap.data.size(), 0);

				// INIT / ACT
				renderer_adapter r2(bitmap, mkvector(0x50, 0x30), 0, blender);

				// ACT
				r2.set_y(0x30);
				r2(0x50, 4, covers);

				// ASSERT
				int reference2[] = {
					0x00305010, 0x00305019, 0x003050F7, 0x003050E3, 0x00000000, 0x00000000, 0x00000000,
					0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000,
					0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000,
					0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000,
					0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000,
				};

				assert_equal(reference2, bitmap.data);
			}